

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *fadexpr)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pFVar5 = (fadexpr->fadexpr_).expr_;
  uVar1 = (pFVar5->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f83773;
    pdVar3 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar3 = (this->dx_).ptr_to_data;
        if (pdVar3 != (double *)0x0) {
          operator_delete__(pdVar3);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f83773;
    }
    if (uVar2 != 0) {
      pdVar3 = (this->dx_).ptr_to_data;
      if (pdVar3 != (double *)0x0) {
        operator_delete__(pdVar3);
        pFVar5 = (fadexpr->fadexpr_).expr_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar8 = (ulong)uVar1 * 8;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar6 = uVar8;
    }
    pdVar3 = (double *)operator_new__(uVar6);
    (this->dx_).ptr_to_data = pdVar3;
    if ((pFVar5->fadexpr_).expr_.dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        do {
          pFVar5 = (fadexpr->fadexpr_).expr_;
          pdVar4 = &(pFVar5->fadexpr_).expr_.defaultVal;
          if ((pFVar5->fadexpr_).expr_.dx_.num_elts != 0) {
            pdVar4 = (double *)((long)(pFVar5->fadexpr_).expr_.dx_.ptr_to_data + lVar7);
          }
          dVar10 = *pdVar4;
          dVar9 = cos((pFVar5->fadexpr_).expr_.val_);
          *(double *)((long)pdVar3 + lVar7) = dVar9 * -dVar10;
          lVar7 = lVar7 + 8;
        } while (uVar8 - lVar7 != 0);
      }
      goto LAB_00f83773;
    }
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      pFVar5 = (fadexpr->fadexpr_).expr_;
      dVar10 = (pFVar5->fadexpr_).expr_.dx_.ptr_to_data[uVar8];
      dVar9 = cos((pFVar5->fadexpr_).expr_.val_);
      pdVar3[uVar8] = dVar9 * -dVar10;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
LAB_00f83773:
  dVar10 = sin((((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.val_);
  this->val_ = -dVar10;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}